

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex7::Run(UnitTest_lex7 *this)

{
  int iVar1;
  LexerWrapper *in_RDI;
  int i;
  LexerWrapper lexer;
  LexerWrapper *in_stack_fffffffffffffe10;
  allocator<char> local_1b9;
  string *in_stack_fffffffffffffe48;
  UnitTestBase *in_stack_fffffffffffffe50;
  allocator local_191;
  string local_190 [32];
  int local_170;
  string *in_stack_fffffffffffffe98;
  LexerWrapper *in_stack_fffffffffffffea0;
  string local_158 [344];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"_ __ ___ _1 _a _a1 a1 a_ a_1 name",(allocator *)&stack0xfffffffffffffea7);
  anon_unknown.dwarf_2562::LexerWrapper::LexerWrapper
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  for (local_170 = 0; local_170 < 10; local_170 = local_170 + 1) {
    iVar1 = anon_unknown.dwarf_2562::LexerWrapper::GetToken(in_RDI);
    if (iVar1 != 0x115) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"\'lexer.GetToken() == luna::Token_Id\'",&local_191);
      UnitTestBase::Error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
  }
  iVar1 = anon_unknown.dwarf_2562::LexerWrapper::GetToken(in_RDI);
  if (iVar1 != 0x11e) {
    in_stack_fffffffffffffe10 = (LexerWrapper *)&local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe48,"\'lexer.GetToken() == luna::Token_EOF\'",
               (allocator *)in_stack_fffffffffffffe10);
    UnitTestBase::Error(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    std::allocator<char>::~allocator(&local_1b9);
  }
  anon_unknown.dwarf_2562::LexerWrapper::~LexerWrapper(in_stack_fffffffffffffe10);
  return;
}

Assistant:

TEST_CASE(lex7)
{
    LexerWrapper lexer("_ __ ___ _1 _a _a1 a1 a_ a_1 name");
    for (int i = 0; i < 10; ++i)
        EXPECT_TRUE(lexer.GetToken() == luna::Token_Id);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}